

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseIncoming.cpp
# Opt level: O3

Result __thiscall
tonk::SessionIncoming::handleReliableMessage
          (SessionIncoming *this,uint messageType,uint8_t *messageData,uint messageBytes)

{
  uint8_t *data;
  undefined4 in_register_0000000c;
  undefined4 in_register_00000034;
  uint8_t *data_00;
  
  data_00 = (uint8_t *)CONCAT44(in_register_00000034,messageType);
  data = *(uint8_t **)(data_00 + 0x6290);
  if ((uint)messageData == 5) {
    if (data != (uint8_t *)0x0) {
      MessageDecompressor::InsertUncompressed
                ((MessageDecompressor *)(data_00 + 0x4b8),data,(messageBytes - (int)data) - 2);
      data_00[0x6290] = '\0';
      data_00[0x6291] = '\0';
      data_00[0x6292] = '\0';
      data_00[0x6293] = '\0';
      data_00[0x6294] = '\0';
      data_00[0x6295] = '\0';
      data_00[0x6296] = '\0';
      data_00[0x6297] = '\0';
    }
    onCompressed(this,data_00,messageBytes);
  }
  else {
    if ((uint)messageData < 0x1e && data == (uint8_t *)0x0) {
      *(long *)(data_00 + 0x6290) = CONCAT44(in_register_0000000c,messageBytes) + -2;
    }
    deliverMessage(this,messageType,messageData,messageBytes);
  }
  return (Result)(ErrorResult *)this;
}

Assistant:

Result SessionIncoming::handleReliableMessage(
    unsigned messageType,
    const uint8_t* messageData,
    unsigned messageBytes)
{
    TONK_DEBUG_ASSERT(messageType >= protocol::MessageType_StartOfReliables);
    TONK_DEBUG_ASSERT(messageType != protocol::MessageType_Unordered);

    if (messageType == protocol::MessageType_Compressed)
    {
        TONK_VERBOSE_INCOMING_LOG("Handle compressed message block. messageBytes=", messageBytes);

        insertUncompressed(messageData - protocol::kMessageFrameBytes);

        return onCompressed(messageData, messageBytes);
    }

    // Remember the first reliable message that is not Control or Unordered.
    // These types are not included in the compression history buffer
    if (!FirstReliable && messageType < protocol::MessageType_Control) {
        FirstReliable = messageData - protocol::kMessageFrameBytes;
    }

    TONK_VERBOSE_INCOMING_LOG("Handle reliable messageType=", messageType, ". messageBytes=", messageBytes);

    return deliverMessage(messageType, messageData, messageBytes);
}